

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenBoundingBoxesProcess.cpp
# Opt level: O2

void __thiscall utGenBoundingBoxesProcess::SetUp(utGenBoundingBoxesProcess *this)

{
  GenBoundingBoxesProcess *this_00;
  aiMesh *this_01;
  aiVector3D *paVar1;
  long lVar2;
  aiScene *this_02;
  aiMesh **ppaVar3;
  int iVar4;
  float fVar5;
  
  this_00 = (GenBoundingBoxesProcess *)operator_new(0x18);
  Assimp::GenBoundingBoxesProcess::GenBoundingBoxesProcess(this_00);
  this->mProcess = this_00;
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  this->mMesh = this_01;
  this_01->mNumVertices = 100;
  paVar1 = (aiVector3D *)operator_new__(0x4b0);
  iVar4 = 0;
  memset(paVar1,0,0x4b0);
  this_01->mVertices = paVar1;
  for (lVar2 = 8; lVar2 != 0x4b8; lVar2 = lVar2 + 0xc) {
    fVar5 = (float)iVar4;
    paVar1 = this->mMesh->mVertices;
    *(float *)((long)paVar1 + lVar2 + -8) = fVar5;
    *(float *)((long)paVar1 + lVar2 + -4) = fVar5;
    *(float *)((long)&paVar1->x + lVar2) = fVar5;
    iVar4 = iVar4 + 1;
  }
  this_02 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_02);
  this->mScene = this_02;
  this_02->mNumMeshes = 1;
  ppaVar3 = (aiMesh **)operator_new__(8);
  this_02->mMeshes = ppaVar3;
  *ppaVar3 = this->mMesh;
  return;
}

Assistant:

void SetUp() override {
        mProcess = new GenBoundingBoxesProcess;
        mMesh = new aiMesh();
        mMesh->mNumVertices = 100;
        mMesh->mVertices = new aiVector3D[100];
        for (unsigned int i = 0; i < 100; ++i) {
            mMesh->mVertices[i] = aiVector3D((ai_real)i, (ai_real)i, (ai_real)i);
        }
        mScene = new aiScene();
        mScene->mNumMeshes = 1;
        mScene->mMeshes = new aiMesh*[1];
        mScene->mMeshes[0] = mMesh;
    }